

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O3

PolyNf * __thiscall
Inferences::PolynomialEvaluation::simplifySummation<Kernel::NumTraits<Kernel::RealConstantType>>
          (PolyNf *__return_storage_ptr__,PolynomialEvaluation *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *summands,
          bool removeZeros)

{
  Entry *pEVar1;
  long lVar2;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
  *pDVar3;
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
  *pDVar4;
  int iVar5;
  mp_limb_t *pmVar6;
  bool bVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  Entry *pEVar11;
  __mpz_struct *r;
  uint uVar12;
  anon_class_16_2_f84bbffd_conflict f;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> monom;
  Numeral numeral;
  int local_150;
  char local_14c;
  undefined1 local_138 [24];
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *local_120;
  int local_118;
  mp_limb_t *local_110;
  RationalConstantType local_108;
  int local_e8;
  undefined4 uStack_e4;
  mp_limb_t *pmStack_e0;
  Lib local_d8 [16];
  RealConstantType local_c8;
  RealConstantType local_a8;
  RationalConstantType local_88;
  Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_68;
  AnyPoly local_44;
  
  pEVar11 = (this->_memo)._memo._entries;
  pEVar1 = (this->_memo)._memo._afterLast;
  local_150 = 0;
  if (pEVar11 != pEVar1) {
    uVar8 = ((long)pEVar1 - (long)pEVar11 >> 4) * -0x5555555555555555;
    lVar9 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar11,pEVar1,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>*,__gnu_cxx::__ops::_Iter_less_iter>
              (pEVar11,pEVar1);
    pEVar11 = (this->_memo)._memo._entries;
    if ((this->_memo)._memo._afterLast != pEVar11) {
      uVar8 = 0;
      local_150 = 0;
      do {
        Kernel::RealConstantType::RealConstantType
                  ((RealConstantType *)local_138,(RealConstantType *)(&pEVar11->code + uVar8 * 0xc))
        ;
        local_118 = *(int *)((long)&pEVar11->_value + uVar8 * 0x30 + 4);
        local_110 = *(mp_limb_t **)((long)&pEVar11->_value + uVar8 * 0x30 + 0xc);
        Kernel::RealConstantType::RealConstantType
                  ((RealConstantType *)&local_88,(RealConstantType *)local_138);
        pmVar6 = local_110;
        iVar5 = local_118;
        uVar12 = (uint)uVar8;
        pEVar11 = (this->_memo)._memo._entries;
        lVar9 = (long)(this->_memo)._memo._afterLast - (long)pEVar11;
        while( true ) {
          uVar12 = uVar12 + 1;
          uVar8 = (ulong)uVar12;
          if (((ulong)((lVar9 >> 4) * -0x5555555555555555) <= uVar8) ||
             (*(int *)((long)&pEVar11->_value + uVar8 * 0x30 + 4) != iVar5)) break;
          Kernel::RealConstantType::operator+
                    ((RealConstantType *)&local_108,(RealConstantType *)&local_88,
                     (RealConstantType *)(&pEVar11->code + uVar8 * 0xc));
          mpz_set((__mpz_struct *)&local_88,(__mpz_struct *)&local_108);
          mpz_set(local_88._den._val,local_108._den._val);
          mpz_clear(local_108._den._val);
          mpz_clear((__mpz_struct *)&local_108);
          pEVar11 = (this->_memo)._memo._entries;
          lVar9 = (long)(this->_memo)._memo._afterLast - (long)pEVar11;
        }
        local_14c = (char)summands;
        if (local_14c == '\0') {
LAB_004f7f20:
          Kernel::RealConstantType::RealConstantType(&local_a8,(RealConstantType *)&local_88);
          Kernel::RealConstantType::RealConstantType((RealConstantType *)&local_108,&local_a8);
          local_e8 = iVar5;
          pmStack_e0 = pmVar6;
          r = (__mpz_struct *)(&((this->_memo)._memo._entries)->code + (long)local_150 * 0xc);
          mpz_set(r,(__mpz_struct *)&local_108);
          mpz_set(r + 1,local_108._den._val);
          r[2]._mp_alloc = local_e8;
          r[2]._mp_size = uStack_e4;
          r[2]._mp_d = pmStack_e0;
          mpz_clear(local_108._den._val);
          mpz_clear((__mpz_struct *)&local_108);
          mpz_clear(local_a8.super_RationalConstantType._den._val);
          mpz_clear((__mpz_struct *)&local_a8);
          local_150 = local_150 + 1;
        }
        else {
          Kernel::RealConstantType::RealConstantType((RealConstantType *)&local_108,0);
          bVar7 = Kernel::RationalConstantType::operator==(&local_88,&local_108);
          mpz_clear(local_108._den._val);
          mpz_clear((__mpz_struct *)&local_108);
          if (!bVar7) goto LAB_004f7f20;
        }
        mpz_clear(local_88._den._val);
        mpz_clear((__mpz_struct *)&local_88);
        mpz_clear((__mpz_struct *)(local_138 + 0x10));
        mpz_clear((__mpz_struct *)local_138);
        pEVar11 = (this->_memo)._memo._entries;
        uVar10 = ((long)(this->_memo)._memo._afterLast - (long)pEVar11 >> 4) * -0x5555555555555555;
      } while (uVar8 <= uVar10 && uVar10 - uVar8 != 0);
    }
  }
  for (pEVar11 = (Entry *)(&pEVar11->code + (long)local_150 * 0xc);
      pEVar11 != (this->_memo)._memo._afterLast;
      pEVar11 = (Entry *)((pEVar11->_value).__data + 0x14)) {
    mpz_clear((__mpz_struct *)((long)&pEVar11->_key + 0xc));
    mpz_clear((__mpz_struct *)pEVar11);
  }
  pEVar11 = (this->_memo)._memo._entries;
  (this->_memo)._memo._afterLast = (Entry *)((long)&pEVar11->code + (long)local_150 * 0x30);
  if (local_150 == 1) {
    Kernel::RealConstantType::RealConstantType(&local_c8,(RealConstantType *)pEVar11);
    local_138._0_4_ = 1;
    bVar7 = Kernel::operator==(&local_c8,(int *)local_138);
    if ((bVar7) &&
       (lVar9 = *(long *)((long)&((this->_memo)._memo._entries)->_value + 0xc),
       lVar2 = *(long *)(lVar9 + 8),
       (int)((ulong)(*(long *)(lVar9 + 0x10) - lVar2) >> 2) * -0x49249249 == 1)) {
      bVar7 = *(int *)(lVar2 + 0x18) == 1;
    }
    else {
      bVar7 = false;
    }
    mpz_clear(local_c8.super_RationalConstantType._den._val);
    mpz_clear((__mpz_struct *)&local_c8);
    if (bVar7) {
      pDVar3 = *(DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                 **)(*(long *)((long)&((this->_memo)._memo._entries)->_value + 0xc) + 8);
      *(undefined8 *)
       &(__return_storage_ptr__->super_PolyNfSuper)._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = 0;
      pDVar4 = &(__return_storage_ptr__->super_PolyNfSuper)._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
      ;
      (pDVar4->
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      )._content[7] = '\0';
      (pDVar4->
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      )._content[8] = '\0';
      (pDVar4->
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      )._content[9] = '\0';
      (pDVar4->
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      )._content[10] = '\0';
      (pDVar4->
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      )._content[0xb] = '\0';
      (pDVar4->
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      )._content[0xc] = '\0';
      (pDVar4->
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      )._content[0xd] = '\0';
      (pDVar4->
      super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
      )._content[0xe] = '\0';
      *(undefined8 *)
       ((__return_storage_ptr__->super_PolyNfSuper)._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
        ._content + 0xf) = 0;
      *(byte *)&(__return_storage_ptr__->super_PolyNfSuper)._inner.
                super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                .
                super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
           = *(byte *)&(pDVar3->
                       super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
                       ).
                       super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
             & 3;
      f.other = pDVar3;
      f.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>_>
                *)__return_storage_ptr__;
      Lib::CoproductImpl::
      RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
      ::
      switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>>>const&)::_lambda(auto:1)_1_>
                ((RawCoproduct<Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>,Kernel::Variable,Kernel::AnyPoly>
                  *)__return_storage_ptr__,f);
      return __return_storage_ptr__;
    }
  }
  Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)local_138,
             (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)this);
  local_68._capacity = local_138._0_8_;
  local_138._0_8_ = 0;
  local_68._end = local_120;
  local_120 = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  local_68._stack = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)local_138._8_8_;
  local_68._cursor = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)local_138._16_8_;
  local_138._8_8_ = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  local_138._16_8_ = (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x0;
  Lib::
  perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
            (local_d8,(Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)&local_68);
  local_44.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[4] = '\0';
  local_44.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[5] = '\0';
  local_44.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[6] = '\0';
  local_44.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[7] = '\0';
  local_44.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._17_3_ = 0;
  local_44.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._0_1_ = 2;
  local_44.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[0] = (char)local_d8[0];
  local_44.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[1] = (char)local_d8[1];
  local_44.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[2] = (char)local_d8[2];
  local_44.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content[3] = (char)local_d8[3];
  local_44.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content._8_3_ = SUB83(local_d8._8_8_,0);
  local_44.super_AnyPolySuper._inner.
  super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
  .
  super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  ._content._11_5_ = SUB85(local_d8._8_8_,3);
  Kernel::PolyNf::PolyNf(__return_storage_ptr__,&local_44);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack(&local_68);
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack
            ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)local_138);
  return __return_storage_ptr__;
}

Assistant:

PolyNf PolynomialEvaluation::simplifySummation(Stack<Monom<Number>> summands, bool removeZeros)
{ 
  using Monom   = Monom<Number>;
  using Polynom = Polynom<Number>;

  // then we sort them by their monom, in order to add up the coefficients efficiently
  std::sort(summands.begin(), summands.end());

  // add up the coefficients (in place)
  {
    auto offs = 0;
    for (unsigned i = 0; i < summands.size(); i++) { 
      auto monom = summands[i];
      auto numeral = monom.numeral;
      auto factors = monom.factors;
      while ( i + 1 < summands.size() && summands[i+1].factors == factors ) {
        numeral = numeral + summands[i+1].numeral;
        i++;
      }
      if (!removeZeros || numeral != Number::constant(0)) 
        summands[offs++] = Monom(numeral, factors);
    }
    summands.truncate(offs);
  }

  if (summands.size() == 1 
      && summands[0].numeral == 1
      && summands[0].factors->nFactors() == 1
      && summands[0].factors->factorAt(0).power == 1
      ) {
    return summands[0].factors->factorAt(0).term;
  } else {
    auto poly = Polynom(std::move(summands));
    poly.integrity();
    return PolyNf(AnyPoly(perfect(std::move(poly))));
  }
}